

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

PortConnection * __thiscall
slang::ast::InstanceSymbol::getPortConnection(InstanceSymbol *this,PortSymbol *port)

{
  long lVar1;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar2;
  bool bVar3;
  raw_key_type *__y;
  pointer ppVar4;
  undefined8 in_RSI;
  long in_RDI;
  iterator it;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  *in_stack_fffffffffffffeb8;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffec0;
  group15<boost::unordered::detail::foa::plain_integral> *in_stack_fffffffffffffec8;
  undefined1 local_100 [16];
  table_element_pointer local_f0;
  slot_type local_e8 [16];
  PortConnection *local_d8;
  group15<boost::unordered::detail::foa::plain_integral> *local_d0;
  long local_c8;
  char_pointer local_c0;
  table_element_pointer local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
  local_b0;
  group15<boost::unordered::detail::foa::plain_integral> *local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  group15<boost::unordered::detail::foa::plain_integral> *local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  group15<boost::unordered::detail::foa::plain_integral> *local_10;
  long local_8;
  
  local_e8._0_8_ = in_RSI;
  if (*(long *)(in_RDI + 0x60) == 0) {
    resolvePortConnections((InstanceSymbol *)it.p_);
  }
  lVar1 = *(long *)(in_RDI + 0x60);
  local_100[0] = local_e8[0].n;
  local_100[1] = local_e8[1].n;
  local_100[2] = local_e8[2].n;
  local_100[3] = local_e8[3].n;
  local_100[4] = local_e8[4].n;
  local_100[5] = local_e8[5].n;
  local_100[6] = local_e8[6].n;
  local_100[7] = local_e8[7].n;
  local_d0 = (group15<boost::unordered::detail::foa::plain_integral> *)local_100;
  local_c8 = lVar1;
  local_98 = local_d0;
  local_90 = lVar1;
  local_70 = local_d0;
  local_68 = lVar1;
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::hash_for<unsigned_long>
                       (in_stack_fffffffffffffec0,(unsigned_long *)in_stack_fffffffffffffeb8);
  pgVar2 = local_70;
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::position_for(in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
  local_10 = pgVar2;
  local_20 = local_78;
  local_8 = lVar1;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::groups((table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)0x422f65);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match(in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::elements((table_arrays<std::pair<const_unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)0x422fb0);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffec0 =
             (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                        *)0x423000);
        in_stack_fffffffffffffec8 = local_10;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
              ::key_from<std::pair<unsigned_long_const,unsigned_long>>
                        ((pair<const_unsigned_long,_unsigned_long> *)0x42302d);
        bVar3 = std::equal_to<unsigned_long>::operator()
                          ((equal_to<unsigned_long> *)in_stack_fffffffffffffec0,
                           (unsigned_long *)in_stack_fffffffffffffec8,__y);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
          ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
          goto LAB_00423121;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    if (bVar3) break;
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)(lVar1 + 8));
    if (!bVar3) {
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
      ::table_locator(&local_b0);
LAB_00423121:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::make_iterator((locator *)0x42312e);
      local_c0 = local_88.pc_;
      local_b8 = local_88.p_;
      local_100._8_8_ = local_88.pc_;
      local_f0 = local_88.p_;
      boost::unordered::
      unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::end((unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             *)0x423189);
      bVar3 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                          *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if (bVar3) {
        local_d8 = (PortConnection *)0x0;
      }
      else {
        ppVar4 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<unsigned_long,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)in_stack_fffffffffffffec0);
        local_d8 = (PortConnection *)ppVar4->second;
      }
      return local_d8;
    }
  }
  memset(&local_b0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_unsigned_long,_unsigned_long>_>
  ::table_locator(&local_b0);
  goto LAB_00423121;
}

Assistant:

const PortConnection* InstanceSymbol::getPortConnection(const PortSymbol& port) const {
    if (!connectionMap)
        resolvePortConnections();

    auto it = connectionMap->find(reinterpret_cast<uintptr_t>(&port));
    if (it == connectionMap->end())
        return nullptr;

    return reinterpret_cast<const PortConnection*>(it->second);
}